

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double chebyshev1_cdf_inv(double cdf)

{
  double dVar1;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dVar1 = sin((cdf + -0.5) * 3.141592653589793);
    return dVar1;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"CHEBYSHEV1_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double chebyshev1_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBYSHEV1_CDF_INV inverts the Chebyshev1 CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    01 August 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Output, double CHEBYSHEV1_CDF_INV, the corresponding argument.
//
{
  double x;
  const double r8_pi = 3.14159265358979323;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "CHEBYSHEV1_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  x = sin ( r8_pi * ( cdf - 0.5 ) );

  return x;
}